

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

UnknownField __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,Arena *arena)

{
  undefined4 uVar1;
  undefined4 uVar2;
  UnknownField UVar3;
  Type TVar4;
  UnknownFieldSet *group;
  Arena *arena_local;
  UnknownField *this_local;
  UnknownField copy;
  
  uVar1 = this->number_;
  uVar2 = this->type_;
  UVar3.type_ = uVar2;
  UVar3.number_ = uVar1;
  copy._0_8_ = this->data_;
  TVar4 = type(this);
  if (TVar4 == TYPE_LENGTH_DELIMITED) {
    copy._0_8_ = Arena::Create<std::__cxx11::string,std::__cxx11::string&>
                           (arena,(this->data_).string_value);
  }
  else if (TVar4 == TYPE_GROUP) {
    copy._0_8_ = Arena::Create<google::protobuf::UnknownFieldSet>(arena);
    UnknownFieldSet::MergeFrom((UnknownFieldSet *)copy._0_8_,(this->data_).group_);
  }
  UVar3.data_ = (anon_union_8_5_75b44293_for_data_)copy._0_8_;
  return UVar3;
}

Assistant:

UnknownField UnknownField::DeepCopy(Arena* arena) const {
  UnknownField copy = *this;
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      copy.data_.string_value =
          Arena::Create<std::string>(arena, *data_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = Arena::Create<UnknownFieldSet>(arena);
      group->MergeFrom(*data_.group_);
      copy.data_.group_ = group;
      break;
    }
    default:
      break;
  }
  return copy;
}